

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

void __thiscall
Assimp::BlenderImporter::ConvertBlendFile
          (BlenderImporter *this,aiScene *out,Scene *in,FileDatabase *file)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  aiNode *this_00;
  aiNode **__s;
  ulong uVar6;
  aiNode *paVar7;
  aiMesh **__dest;
  aiLight **__dest_00;
  aiCamera **__dest_01;
  aiMaterial **__dest_02;
  aiTexture **__dest_03;
  Object **ppOVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  element_type *peVar12;
  long lVar13;
  shared_ptr<Assimp::Blender::Base> cur;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  no_parents;
  ConversionData conv;
  element_type *local_228;
  undefined1 local_220 [12];
  float fStack_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  undefined8 uStack_200;
  float local_1f8;
  undefined8 local_1f4;
  undefined8 uStack_1ec;
  float local_1e4;
  BlenderImporter *local_1e0;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_1d8;
  ConversionData local_180;
  
  local_1e0 = this;
  Blender::ConversionData::ConversionData(&local_180,file);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _M_initialize_map(&local_1d8,0);
  peVar5 = (in->base).first.
           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_220._0_4_ = SUB84(peVar5,0);
  local_220._4_4_ = (undefined4)((ulong)peVar5 >> 0x20);
  p_Var1 = (in->base).first.
           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_220._8_4_ = SUB84(p_Var1,0);
  fStack_214 = (float)((ulong)p_Var1 >> 0x20);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (peVar5 != (element_type *)0x0) {
    do {
      peVar2 = (element_type *)peVar5[2].dna_type;
      if (peVar2 != (element_type *)0x0) {
        local_228 = peVar2;
        if (peVar2->parent == (Object *)0x0) {
          if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::
            deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>::
            _M_push_back_aux<Assimp::Blender::Object_const*>
                      ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                        *)&local_1d8,&local_228);
          }
          else {
            *local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = peVar2;
            local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        else {
          std::
          _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
          ::_M_insert_unique<Assimp::Blender::Object_const*>
                    ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_180,&local_228);
        }
      }
      lVar13 = CONCAT44(local_220._4_4_,local_220._0_4_);
      uVar3 = *(undefined8 *)(lVar13 + 0x18);
      local_220._0_4_ = (undefined4)uVar3;
      local_220._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar13 + 0x20));
      peVar5 = (element_type *)CONCAT44(local_220._4_4_,local_220._0_4_);
    } while (peVar5 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_))
    ;
  }
  peVar12 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_220._0_4_ = SUB84(peVar12,0);
  local_220._4_4_ = (undefined4)((ulong)peVar12 >> 0x20);
  p_Var1 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_220._8_4_ = SUB84(p_Var1,0);
  fStack_214 = (float)((ulong)p_Var1 >> 0x20);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (peVar12 != (element_type *)0x0) {
    do {
      peVar2 = (peVar12->object).
               super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (peVar2->parent != (Object *)0x0)) {
        local_228 = peVar2;
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::_M_insert_unique<Assimp::Blender::Object_const*>
                  ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                    *)&local_180,&local_228);
        peVar12 = (element_type *)CONCAT44(local_220._4_4_,local_220._0_4_);
      }
      peVar4 = (peVar12->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_220._0_4_ = SUB84(peVar4,0);
      local_220._4_4_ = (undefined4)((ulong)peVar4 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),
                 &(peVar12->next).
                  super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      peVar12 = (element_type *)CONCAT44(local_220._4_4_,local_220._0_4_);
    } while (peVar12 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_214,local_220._8_4_))
    ;
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_220._0_8_ = &aStack_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,"Expected at least one object with no parent","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != &aStack_210) {
      operator_delete((void *)local_220._0_8_);
    }
  }
  this_00 = (aiNode *)operator_new(0x478);
  local_220._0_8_ = &aStack_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"<BlenderRoot>","");
  aiNode::aiNode(this_00,(string *)local_220);
  out->mRootNode = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != &aStack_210) {
    operator_delete((void *)local_220._0_8_);
  }
  uVar11 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40;
  uVar10 = (uint)uVar11;
  this_00->mNumChildren = uVar10;
  uVar11 = (uVar11 & 0xffffffff) << 3;
  __s = (aiNode **)operator_new__(uVar11);
  memset(__s,0,uVar11);
  this_00->mChildren = __s;
  if (uVar10 != 0) {
    lVar13 = 0;
    uVar11 = 0;
    do {
      uVar6 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar11;
      if ((long)uVar6 < 0) {
        uVar9 = (long)uVar6 >> 6;
LAB_00493be3:
        ppOVar8 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar9] +
                  uVar6 + uVar9 * -0x40;
      }
      else {
        if (0x3f < uVar6) {
          uVar9 = uVar6 >> 6;
          goto LAB_00493be3;
        }
        ppOVar8 = (Object **)
                  ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar13);
      }
      local_220._0_4_ = 1.0;
      local_220._4_4_ = 0.0;
      local_220._8_4_ = 0.0;
      fStack_214 = 0.0;
      aStack_210._M_allocated_capacity._0_4_ = 0;
      aStack_210._M_allocated_capacity._4_4_ = 0x3f800000;
      aStack_210._8_8_ = 0;
      uStack_200._0_4_ = 0.0;
      uStack_200._4_4_ = 0.0;
      local_1f8 = 1.0;
      local_1f4._0_4_ = 0.0;
      local_1f4._4_4_ = 0.0;
      uStack_1ec._0_4_ = 0.0;
      uStack_1ec._4_4_ = 0.0;
      local_1e4 = 1.0;
      paVar7 = ConvertNode(local_1e0,in,*ppOVar8,&local_180,(aiMatrix4x4 *)local_220);
      *(aiNode **)((long)this_00->mChildren + lVar13) = paVar7;
      *(aiNode **)(*(long *)((long)this_00->mChildren + lVar13) + 0x448) = this_00;
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar11 < this_00->mNumChildren);
  }
  BuildMaterials(local_1e0,&local_180);
  uVar11 = (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    out->mNumMeshes = (uint)(uVar11 >> 3);
    __dest = (aiMesh **)operator_new__(uVar11 & 0x7fffffff8);
    out->mMeshes = __dest;
    memmove(__dest,local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,uVar11);
    local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar11 = (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    out->mNumLights = (uint)(uVar11 >> 3);
    __dest_00 = (aiLight **)operator_new__(uVar11 & 0x7fffffff8);
    out->mLights = __dest_00;
    memmove(__dest_00,
            local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_start,uVar11);
    local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar11 = (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    out->mNumCameras = (uint)(uVar11 >> 3);
    __dest_01 = (aiCamera **)operator_new__(uVar11 & 0x7fffffff8);
    out->mCameras = __dest_01;
    memmove(__dest_01,
            local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar11);
    local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar11 = (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    out->mNumMaterials = (uint)(uVar11 >> 3);
    __dest_02 = (aiMaterial **)operator_new__(uVar11 & 0x7fffffff8);
    out->mMaterials = __dest_02;
    memmove(__dest_02,
            local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar11);
    local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  uVar11 = (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 != 0) {
    out->mNumTextures = (uint)(uVar11 >> 3);
    __dest_03 = (aiTexture **)operator_new__(uVar11 & 0x7fffffff8);
    out->mTextures = __dest_03;
    memmove(__dest_03,
            local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start,uVar11);
    local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  if (out->mNumMeshes == 0) {
    *(byte *)&out->mFlags = (byte)out->mFlags | 1;
  }
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_1d8);
  std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::~deque(&local_180.materials_raw);
  Blender::TempArray<std::vector,_aiTexture>::~TempArray(&local_180.textures);
  Blender::TempArray<std::vector,_aiMaterial>::~TempArray(&local_180.materials);
  Blender::TempArray<std::vector,_aiLight>::~TempArray(&local_180.lights);
  Blender::TempArray<std::vector,_aiCamera>::~TempArray(&local_180.cameras);
  Blender::TempArray<std::vector,_aiMesh>::~TempArray(&local_180.meshes);
  std::
  _Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
  ::~_Rb_tree((_Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
               *)&local_180);
  return;
}

Assistant:

void BlenderImporter::ConvertBlendFile(aiScene* out, const Scene& in,const FileDatabase& file)
{
    ConversionData conv(file);

    // FIXME it must be possible to take the hierarchy directly from
    // the file. This is terrible. Here, we're first looking for
    // all objects which don't have parent objects at all -
    std::deque<const Object*> no_parents;
    for (std::shared_ptr<Base> cur = std::static_pointer_cast<Base> ( in.base.first ); cur; cur = cur->next) {
        if (cur->object) {
            if(!cur->object->parent) {
                no_parents.push_back(cur->object.get());
            } else {
                conv.objects.insert( cur->object.get() );
            }
        }
    }
    for (std::shared_ptr<Base> cur = in.basact; cur; cur = cur->next) {
        if (cur->object) {
            if(cur->object->parent) {
                conv.objects.insert(cur->object.get());
            }
        }
    }

    if (no_parents.empty()) {
        ThrowException("Expected at least one object with no parent");
    }

    aiNode* root = out->mRootNode = new aiNode("<BlenderRoot>");

    root->mNumChildren = static_cast<unsigned int>(no_parents.size());
    root->mChildren = new aiNode*[root->mNumChildren]();
    for (unsigned int i = 0; i < root->mNumChildren; ++i) {
        root->mChildren[i] = ConvertNode(in, no_parents[i], conv, aiMatrix4x4());
        root->mChildren[i]->mParent = root;
    }

    BuildMaterials(conv);

    if (conv.meshes->size()) {
        out->mMeshes = new aiMesh*[out->mNumMeshes = static_cast<unsigned int>( conv.meshes->size() )];
        std::copy(conv.meshes->begin(),conv.meshes->end(),out->mMeshes);
        conv.meshes.dismiss();
    }

    if (conv.lights->size()) {
        out->mLights = new aiLight*[out->mNumLights = static_cast<unsigned int>( conv.lights->size() )];
        std::copy(conv.lights->begin(),conv.lights->end(),out->mLights);
        conv.lights.dismiss();
    }

    if (conv.cameras->size()) {
        out->mCameras = new aiCamera*[out->mNumCameras = static_cast<unsigned int>( conv.cameras->size() )];
        std::copy(conv.cameras->begin(),conv.cameras->end(),out->mCameras);
        conv.cameras.dismiss();
    }

    if (conv.materials->size()) {
        out->mMaterials = new aiMaterial*[out->mNumMaterials = static_cast<unsigned int>( conv.materials->size() )];
        std::copy(conv.materials->begin(),conv.materials->end(),out->mMaterials);
        conv.materials.dismiss();
    }

    if (conv.textures->size()) {
        out->mTextures = new aiTexture*[out->mNumTextures = static_cast<unsigned int>( conv.textures->size() )];
        std::copy(conv.textures->begin(),conv.textures->end(),out->mTextures);
        conv.textures.dismiss();
    }

    // acknowledge that the scene might come out incomplete
    // by Assimp's definition of `complete`: blender scenes
    // can consist of thousands of cameras or lights with
    // not a single mesh between them.
    if (!out->mNumMeshes) {
        out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}